

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

void Commands::Book(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *arguments,Character *from)

{
  World *pWVar1;
  Character *pCVar2;
  bool bVar3;
  int iVar4;
  const_reference pvVar5;
  Character *this;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
  *pmVar12;
  reference ppVar13;
  element_type *peVar14;
  Quest *pQVar15;
  string local_210;
  undefined1 local_1f0 [8];
  pair<const_short,_std::shared_ptr<Quest_Context>_> quest_1;
  iterator __end2_1;
  iterator __begin2_1;
  map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
  *__range2_1;
  undefined1 local_1a0 [8];
  pair<const_short,_std::shared_ptr<Quest_Context>_> quest;
  iterator __end2;
  iterator __begin2;
  map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
  *__range2;
  size_t reserve;
  string local_148 [32];
  undefined1 local_128 [8];
  PacketBuilder reply;
  string rank_str;
  string guild_str;
  string home_str;
  string local_90;
  string local_70;
  string local_40;
  Character *local_20;
  Character *victim;
  Character *from_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arguments_local;
  
  pWVar1 = from->world;
  victim = from;
  from_local = (Character *)arguments;
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](arguments,0);
  std::__cxx11::string::string((string *)&local_40,(string *)pvVar5);
  this = World::GetCharacter(pWVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  pCVar2 = victim;
  local_20 = this;
  if (this == (Character *)0x0) {
    pWVar1 = victim->world;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"character_not_found",
               (allocator<char> *)(home_str.field_2._M_local_buf + 0xf));
    I18N::Format<>(&local_70,&pWVar1->i18n,&local_90);
    (*(pCVar2->super_Command_Source)._vptr_Command_Source[5])(pCVar2,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)(home_str.field_2._M_local_buf + 0xf));
  }
  else {
    Character::HomeString_abi_cxx11_((string *)((long)&guild_str.field_2 + 8),this);
    Character::GuildNameString_abi_cxx11_((string *)((long)&rank_str.field_2 + 8),local_20);
    Character::GuildRankString_abi_cxx11_((string *)&reply.add_size,local_20);
    (*(local_20->super_Command_Source)._vptr_Command_Source[2])(local_148);
    lVar6 = std::__cxx11::string::length();
    lVar7 = std::__cxx11::string::length();
    lVar8 = std::__cxx11::string::length();
    lVar9 = std::__cxx11::string::length();
    lVar10 = std::__cxx11::string::length();
    lVar11 = std::__cxx11::string::length();
    PacketBuilder::PacketBuilder
              ((PacketBuilder *)local_128,PACKET_BOOK,PACKET_REPLY,
               lVar11 + 0xd + lVar6 + lVar7 + lVar8 + lVar9 + lVar10);
    std::__cxx11::string::~string(local_148);
    (*(local_20->super_Command_Source)._vptr_Command_Source[2])(&reserve);
    PacketBuilder::AddBreakString((PacketBuilder *)local_128,(string *)&reserve,0xff);
    std::__cxx11::string::~string((string *)&reserve);
    PacketBuilder::AddBreakString
              ((PacketBuilder *)local_128,(string *)((long)&guild_str.field_2 + 8),0xff);
    PacketBuilder::AddBreakString((PacketBuilder *)local_128,&local_20->partner,0xff);
    PacketBuilder::AddBreakString((PacketBuilder *)local_128,&local_20->title,0xff);
    PacketBuilder::AddBreakString
              ((PacketBuilder *)local_128,(string *)((long)&rank_str.field_2 + 8),0xff);
    PacketBuilder::AddBreakString((PacketBuilder *)local_128,(string *)&reply.add_size,0xff);
    iVar4 = Character::PlayerID(local_20);
    PacketBuilder::AddShort((PacketBuilder *)local_128,iVar4);
    PacketBuilder::AddChar((PacketBuilder *)local_128,(uint)local_20->clas);
    PacketBuilder::AddChar((PacketBuilder *)local_128,(uint)local_20->gender);
    PacketBuilder::AddChar((PacketBuilder *)local_128,0);
    iVar4 = (*(local_20->super_Command_Source)._vptr_Command_Source[1])();
    if ((byte)iVar4 < 4) {
      iVar4 = (*(local_20->super_Command_Source)._vptr_Command_Source[1])();
      if ((char)iVar4 == '\0') {
        if (local_20->party == (Party *)0x0) {
          PacketBuilder::AddChar((PacketBuilder *)local_128,0);
        }
        else {
          PacketBuilder::AddChar((PacketBuilder *)local_128,6);
        }
      }
      else if (local_20->party == (Party *)0x0) {
        PacketBuilder::AddChar((PacketBuilder *)local_128,4);
      }
      else {
        PacketBuilder::AddChar((PacketBuilder *)local_128,9);
      }
    }
    else if (local_20->party == (Party *)0x0) {
      PacketBuilder::AddChar((PacketBuilder *)local_128,5);
    }
    else {
      PacketBuilder::AddChar((PacketBuilder *)local_128,10);
    }
    PacketBuilder::AddByte((PacketBuilder *)local_128,0xff);
    __range2 = (map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
                *)0x0;
    pmVar12 = &local_20->quests;
    __end2 = std::
             map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
             ::begin(pmVar12);
    quest.second.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
         ::end(pmVar12);
    while (bVar3 = std::operator!=(&__end2,(_Self *)&quest.second.
                                                                                                          
                                                  super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount), bVar3) {
      ppVar13 = std::_Rb_tree_iterator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>::
                operator*(&__end2);
      std::pair<const_short,_std::shared_ptr<Quest_Context>_>::pair
                ((pair<const_short,_std::shared_ptr<Quest_Context>_> *)local_1a0,ppVar13);
      bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&quest);
      if (bVar3) {
        peVar14 = std::__shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&quest);
        bVar3 = EOPlus::Context::Finished(&peVar14->super_Context);
        if (bVar3) {
          peVar14 = std::
                    __shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&quest);
          bVar3 = Quest_Context::IsHidden(peVar14);
          if (!bVar3) {
            peVar14 = std::
                      __shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&quest);
            pQVar15 = Quest_Context::GetQuest(peVar14);
            Quest::Name_abi_cxx11_((string *)&__range2_1,pQVar15);
            lVar6 = std::__cxx11::string::length();
            __range2 = (map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
                        *)(&(__range2->_M_t)._M_impl.field_0x1 + lVar6);
            std::__cxx11::string::~string((string *)&__range2_1);
          }
        }
      }
      std::pair<const_short,_std::shared_ptr<Quest_Context>_>::~pair
                ((pair<const_short,_std::shared_ptr<Quest_Context>_> *)local_1a0);
      std::_Rb_tree_iterator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>::operator++
                (&__end2);
    }
    PacketBuilder::ReserveMore((PacketBuilder *)local_128,(size_t)__range2);
    pmVar12 = &local_20->quests;
    __end2_1 = std::
               map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
               ::begin(pmVar12);
    quest_1.second.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
         ::end(pmVar12);
    while (bVar3 = std::operator!=(&__end2_1,
                                   (_Self *)&quest_1.second.
                                             super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount), bVar3) {
      ppVar13 = std::_Rb_tree_iterator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>::
                operator*(&__end2_1);
      std::pair<const_short,_std::shared_ptr<Quest_Context>_>::pair
                ((pair<const_short,_std::shared_ptr<Quest_Context>_> *)local_1f0,ppVar13);
      bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&quest_1);
      if (bVar3) {
        peVar14 = std::__shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&quest_1);
        bVar3 = EOPlus::Context::Finished(&peVar14->super_Context);
        if (bVar3) {
          peVar14 = std::
                    __shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&quest_1);
          bVar3 = Quest_Context::IsHidden(peVar14);
          if (!bVar3) {
            peVar14 = std::
                      __shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&quest_1);
            pQVar15 = Quest_Context::GetQuest(peVar14);
            Quest::Name_abi_cxx11_(&local_210,pQVar15);
            PacketBuilder::AddBreakString((PacketBuilder *)local_128,&local_210,0xff);
            std::__cxx11::string::~string((string *)&local_210);
          }
        }
      }
      std::pair<const_short,_std::shared_ptr<Quest_Context>_>::~pair
                ((pair<const_short,_std::shared_ptr<Quest_Context>_> *)local_1f0);
      std::_Rb_tree_iterator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>::operator++
                (&__end2_1);
    }
    Character::Send(victim,(PacketBuilder *)local_128);
    PacketBuilder::~PacketBuilder((PacketBuilder *)local_128);
    std::__cxx11::string::~string((string *)&reply.add_size);
    std::__cxx11::string::~string((string *)(rank_str.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(guild_str.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void Book(const std::vector<std::string>& arguments, Character* from)
{
	Character *victim = from->world->GetCharacter(arguments[0]);

	if (!victim)
	{
		from->ServerMsg(from->world->i18n.Format("character_not_found"));
	}
	else
	{
		std::string home_str = victim->HomeString();
		std::string guild_str = victim->GuildNameString();
		std::string rank_str = victim->GuildRankString();

		PacketBuilder reply(PACKET_BOOK, PACKET_REPLY,
			13 + victim->SourceName().length() + home_str.length() + victim->partner.length() + victim->title.length()
			+ guild_str.length() + rank_str.length());

		reply.AddBreakString(victim->SourceName());
		reply.AddBreakString(home_str);
		reply.AddBreakString(victim->partner);
		reply.AddBreakString(victim->title);
		reply.AddBreakString(guild_str);
		reply.AddBreakString(rank_str);
		reply.AddShort(victim->PlayerID());
		reply.AddChar(victim->clas);
		reply.AddChar(victim->gender);
		reply.AddChar(0);

		if (victim->SourceDutyAccess() >= ADMIN_HGM)
		{
			if (victim->party)
			{
				reply.AddChar(ICON_HGM_PARTY);
			}
			else
			{
				reply.AddChar(ICON_HGM);
			}
		}
		else if (victim->SourceDutyAccess() >= ADMIN_GUIDE)
		{
			if (victim->party)
			{
				reply.AddChar(ICON_GM_PARTY);
			}
			else
			{
				reply.AddChar(ICON_GM);
			}
		}
		else
		{
			if (victim->party)
			{
				reply.AddChar(ICON_PARTY);
			}
			else
			{
				reply.AddChar(ICON_NORMAL);
			}
		}

		reply.AddByte(255);

		std::size_t reserve = 0;

		UTIL_FOREACH(victim->quests, quest)
		{
			if (quest.second && quest.second->Finished() && !quest.second->IsHidden())
				reserve += quest.second->GetQuest()->Name().length() + 1;
		}

		reply.ReserveMore(reserve);

		UTIL_FOREACH(victim->quests, quest)
		{
			if (quest.second && quest.second->Finished() && !quest.second->IsHidden())
				reply.AddBreakString(quest.second->GetQuest()->Name());
		}

		from->Send(reply);
	}
}